

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.cpp
# Opt level: O2

int main(void)

{
  Unused *this;
  ostream *poVar1;
  Unused ob2;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Unused::Unused(&ob2);
  this = (Unused *)operator_new(1);
  Unused::Unused(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"This fall through is intentional.\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
	std::cout << std::endl;
	// [[maybe_unused]]
	Unused ob2; //Stack
	Unused *ob1 = new Unused(); //Heap

	// [[nodiscard]]
	nodiscard_eg();

	//[[fallthrough]]
	switch (1) {
		case 1:
			std::cout << "This fall through is intentional.\n" << std::endl;
			[[fallthrough]];
		case 2:
			break;
	}
}